

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O0

bool __thiscall zmq::xsub_t::xhas_in(xsub_t *this)

{
  bool bVar1;
  byte bVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *in_RCX;
  void *in_RDX;
  void *__buf;
  xsub_t *in_RDI;
  undefined8 in_R8;
  char *errstr_1;
  char *errstr;
  int rc;
  uint in_stack_ffffffffffffffe8;
  xsub_t *this_00;
  bool local_1;
  
  if ((in_RDI->_more_recv & 1U) == 0) {
    this_00 = in_RDI;
    if ((in_RDI->_has_message & 1U) == 0) {
      while( true ) {
        sVar3 = fq_t::recv(&in_RDI->_fq,(int)in_RDI + 0x770,in_RDX,(size_t)in_RCX,(int)in_R8);
        if ((int)sVar3 != 0) break;
        if ((((in_RDI->super_socket_base_t).super_own_t.options.filter & 1U) == 0) ||
           (bVar1 = match(this_00,(msg_t *)(ulong)in_stack_ffffffffffffffe8), bVar1)) {
          in_RDI->_has_message = true;
          return true;
        }
        while (bVar2 = msg_t::flags(&in_RDI->_message), in_RDX = __buf, (bVar2 & 1) != 0) {
          sVar3 = fq_t::recv(&in_RDI->_fq,(int)in_RDI + 0x770,__buf,(size_t)in_RCX,(int)in_R8);
          if ((int)sVar3 != 0) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            in_RCX = 
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
            ;
            in_R8 = 0xf7;
            fprintf(_stderr,"%s (%s:%d)\n",pcVar5);
            fflush(_stderr);
            zmq_abort((char *)0x21bbfe);
          }
        }
      }
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
                ,0xe9);
        fflush(_stderr);
        zmq_abort((char *)0x21bb0f);
      }
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool zmq::xsub_t::xhas_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more_recv)
        return true;

    //  If there's already a message prepared by a previous call to zmq_poll,
    //  return straight ahead.
    if (_has_message)
        return true;

    //  TODO: This can result in infinite loop in the case of continuous
    //  stream of non-matching messages.
    while (true) {
        //  Get a message using fair queueing algorithm.
        int rc = _fq.recv (&_message);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0) {
            errno_assert (errno == EAGAIN);
            return false;
        }

        //  Check whether the message matches at least one subscription.
        if (!options.filter || match (&_message)) {
            _has_message = true;
            return true;
        }

        //  Message doesn't match. Pop any remaining parts of the message
        //  from the pipe.
        while (_message.flags () & msg_t::more) {
            rc = _fq.recv (&_message);
            errno_assert (rc == 0);
        }
    }
}